

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.h
# Opt level: O3

void __thiscall despot::History::Add(History *this,ACT_TYPE action,OBS_TYPE obs)

{
  iterator __position;
  iterator __position_00;
  ACT_TYPE local_1c;
  OBS_TYPE local_18;
  
  __position._M_current = *(int **)(this + 8);
  local_1c = action;
  local_18 = obs;
  if (__position._M_current == *(int **)(this + 0x10)) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)this,__position,&local_1c);
  }
  else {
    *__position._M_current = action;
    *(int **)(this + 8) = __position._M_current + 1;
  }
  __position_00._M_current = *(unsigned_long **)(this + 0x20);
  if (__position_00._M_current == *(unsigned_long **)(this + 0x28)) {
    std::vector<unsigned_long,std::allocator<unsigned_long>>::
    _M_realloc_insert<unsigned_long_const&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)(this + 0x18),__position_00,
               &local_18);
  }
  else {
    *__position_00._M_current = obs;
    *(unsigned_long **)(this + 0x20) = __position_00._M_current + 1;
  }
  return;
}

Assistant:

void Add(ACT_TYPE action, OBS_TYPE obs) {
		actions_.push_back(action);
		observations_.push_back(obs);
	}